

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void release_handler_ref(mg_connection *conn,mg_handler_info *handler_info)

{
  mg_context *pmVar1;
  
  if (handler_info != (mg_handler_info *)0x0) {
    pmVar1 = conn->phys_ctx;
    if ((pmVar1 != (mg_context *)0x0) && (pmVar1->context_type == 1)) {
      pthread_mutex_lock((pthread_mutex_t *)&pmVar1->nonce_mutex);
    }
    handler_info->refcount = handler_info->refcount - 1;
    pmVar1 = conn->phys_ctx;
    if ((pmVar1 != (mg_context *)0x0) && (pmVar1->context_type == 1)) {
      pthread_mutex_unlock((pthread_mutex_t *)&pmVar1->nonce_mutex);
      return;
    }
  }
  return;
}

Assistant:

static void
release_handler_ref(struct mg_connection *conn,
                    struct mg_handler_info *handler_info)
{
	if (handler_info != NULL) {
		/* Use context lock for ref counter */
		mg_lock_context(conn->phys_ctx);
		handler_info->refcount--;
		mg_unlock_context(conn->phys_ctx);
	}
}